

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  XML_Convert_Result XVar2;
  char **ppcVar3;
  long lVar4;
  unsigned_short **ppuVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  unsigned_short *in_R8;
  
  ppcVar3 = (char **)(end + -(long)ptr);
  if ((long)ppcVar3 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar8 = 0;
  uVar6 = bVar1 - 5;
  if (uVar6 < 0x14) {
    pcVar7 = (char *)((long)&switchD_004dff1d::switchdataD_005ec358 +
                     (long)(int)(&switchD_004dff1d::switchdataD_005ec358)[uVar6]);
    iVar9 = 0;
    switch((uint)bVar1) {
    case 5:
      iVar9 = -2;
      if (ppcVar3 != (char **)0x1) {
        XVar2 = (*enc[3].scanners[1])(enc,ptr,pcVar7,ppcVar3);
        while( true ) {
          lVar4 = 2;
          while( true ) {
            iVar9 = iVar8;
            if (XVar2 == XML_CONVERT_COMPLETED) goto switchD_004dff1d_caseD_8;
LAB_004dff9d:
            while( true ) {
              ptr = (char *)((long)ptr + lVar4);
              lVar4 = (long)end - (long)ptr;
              if (lVar4 < 1) {
                return -1;
              }
              ppuVar5 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar5);
              if (bVar1 < 0x12) break;
              lVar4 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar9 = iVar8;
                if (bVar1 == 0x12) {
                  ptr = (char *)((long)ptr + 1);
                  iVar9 = 0x1c;
                }
                goto switchD_004dff1d_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (lVar4 < 3) goto LAB_004e0059;
              XVar2 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_004e0023:
              lVar4 = 3;
            }
            else {
              iVar9 = iVar8;
              if (bVar1 != 7) goto switchD_004dff1d_caseD_8;
              if (lVar4 < 4) goto LAB_004e0059;
              XVar2 = (*enc[3].scanners[0])(enc,ptr,(char *)(ulong)bVar1,(char **)ppuVar5);
LAB_004e0001:
              lVar4 = 4;
            }
          }
          if (lVar4 == 1) break;
          XVar2 = (*enc[2].utf16Convert)(enc,(char **)ptr,(char *)(ulong)bVar1,ppuVar5,in_R8);
        }
LAB_004e0059:
        iVar9 = -2;
      }
      break;
    case 6:
      iVar9 = -2;
      if (2 < (long)ppcVar3) {
        XVar2 = (*enc[3].scanners[2])(enc,ptr,pcVar7,ppcVar3);
        goto LAB_004e0023;
      }
      break;
    case 7:
      iVar9 = -2;
      if (3 < (long)ppcVar3) {
        XVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar7,ppcVar3);
        goto LAB_004e0001;
      }
      break;
    default:
      goto switchD_004dff1d_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_004dff1d_caseD_9;
    case 0x16:
    case 0x18:
      lVar4 = 1;
      goto LAB_004dff9d;
    }
  }
  else {
    iVar9 = iVar8;
    if (bVar1 == 0x1e) {
switchD_004dff1d_caseD_9:
      iVar9 = 0x16;
    }
switchD_004dff1d_caseD_8:
    *nextTokPtr = ptr;
  }
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}